

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O2

void stbir__calculate_out_pixel_range
               (int *first_pixel,int *last_pixel,float in_pixel_center,float in_pixels_radius,
               float scale,float out_shift,int out_size)

{
  int iVar1;
  int iVar2;
  int iVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  
  fVar7 = ((in_pixel_center - in_pixels_radius) * scale - out_shift) + 0.5;
  fVar6 = (float)(int)fVar7;
  fVar4 = ((in_pixel_center + in_pixels_radius) * scale - out_shift) + -0.5;
  fVar5 = (float)(int)fVar4;
  iVar2 = (int)((float)(-(uint)(fVar4 < fVar5) & 0xbf800000) + fVar5);
  iVar1 = out_size + -1;
  if (iVar2 < out_size) {
    iVar1 = iVar2;
  }
  iVar3 = (int)((float)(-(uint)(fVar7 < fVar6) & 0xbf800000) + fVar6);
  iVar2 = 0;
  if (0 < iVar3) {
    iVar2 = iVar3;
  }
  *first_pixel = iVar2;
  *last_pixel = iVar1;
  return;
}

Assistant:

static void stbir__calculate_out_pixel_range( int * first_pixel, int * last_pixel, float in_pixel_center, float in_pixels_radius, float scale, float out_shift, int out_size )
{
  float in_pixel_influence_lowerbound = in_pixel_center - in_pixels_radius;
  float in_pixel_influence_upperbound = in_pixel_center + in_pixels_radius;
  float out_pixel_influence_lowerbound = in_pixel_influence_lowerbound * scale - out_shift;
  float out_pixel_influence_upperbound = in_pixel_influence_upperbound * scale - out_shift;
  int out_first_pixel = (int)(STBIR_FLOORF(out_pixel_influence_lowerbound + 0.5f));
  int out_last_pixel = (int)(STBIR_FLOORF(out_pixel_influence_upperbound - 0.5f));

  if ( out_first_pixel < 0 )
    out_first_pixel = 0;
  if ( out_last_pixel >= out_size )
    out_last_pixel = out_size - 1;
  *first_pixel = out_first_pixel;
  *last_pixel = out_last_pixel;
}